

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *
__thiscall
chatra::RuntimeImp::getInstancesState
          (vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
           *__return_storage_ptr__,RuntimeImp *this)

{
  mutex *__mutex;
  __atomic_flag_data_type _Var1;
  char cVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  iterator __position;
  iterator __position_00;
  vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *pvVar5;
  RuntimeImp *pRVar6;
  vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *pvVar7;
  RuntimeImp *pRVar8;
  int iVar9;
  undefined8 *puVar10;
  InstanceState *pIVar11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *local_50;
  vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
  *local_48;
  RuntimeImp *local_40;
  pthread_mutex_t *local_38;
  
  __mutex = &this->lockDebugger;
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  local_38 = (pthread_mutex_t *)__mutex;
  if (this->paused != false) {
    (__return_storage_ptr__->
    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      LOCK();
      _Var1 = (this->instanceIds).lockValues.flag.super___atomic_flag_base._M_i;
      (this->instanceIds).lockValues.flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var1 != false);
    pvVar7 = __return_storage_ptr__;
    pRVar8 = this;
    pvVar5 = local_48;
    pRVar6 = local_40;
    for (p_Var3 = (this->instanceIds).values._M_h._M_before_begin._M_nxt; local_40 = pRVar8,
        local_48 = pvVar7, p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      p_Var4 = p_Var3[2]._M_nxt;
      if ((p_Var4[1]._M_nxt != (_Hash_node_base *)0x1) &&
         (p_Var4[1]._M_nxt !=
          (_Hash_node_base *)
          (((this->gcInstance)._M_t.
            super___uniq_ptr_impl<chatra::Instance,_std::default_delete<chatra::Instance>_>._M_t.
            super__Tuple_impl<0UL,_chatra::Instance_*,_std::default_delete<chatra::Instance>_>.
            super__Head_base<0UL,_chatra::Instance_*,_false>._M_head_impl)->
          super_IdType<chatra::InstanceId,_chatra::Instance>).id)) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
          ::_M_realloc_insert<>(__return_storage_ptr__,__position);
          pIVar11 = (__return_storage_ptr__->
                    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((__position._M_current)->threadIds).
          super__Vector_base<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->threadIds).
          super__Vector_base<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__position._M_current)->instanceId = 0;
          (__position._M_current)->primaryPackageId = 0;
          ((__position._M_current)->threadIds).
          super__Vector_base<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pIVar11 = __position._M_current + 1;
          (__return_storage_ptr__->
          super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
          )._M_impl.super__Vector_impl_data._M_finish = pIVar11;
        }
        pIVar11[-1].instanceId = (InstanceId)p_Var4[1]._M_nxt;
        pIVar11[-1].primaryPackageId = (PackageId)p_Var4[2]._M_nxt;
        do {
          LOCK();
          cVar2 = *(char *)&p_Var4[3]._M_nxt;
          *(undefined1 *)&p_Var4[3]._M_nxt = 1;
          UNLOCK();
        } while (cVar2 != '\0');
        std::vector<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>::
        reserve(&pIVar11[-1].threadIds,(size_type)p_Var4[7]._M_nxt);
        for (p_Var12 = p_Var4[6]._M_nxt; p_Var12 != (_Hash_node_base *)0x0;
            p_Var12 = p_Var12->_M_nxt) {
          local_50 = p_Var12[1]._M_nxt;
          __position_00._M_current =
               pIVar11[-1].threadIds.
               super__Vector_base<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              pIVar11[-1].threadIds.
              super__Vector_base<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>::
            _M_realloc_insert<chatra::debugger::ThreadId>
                      (&pIVar11[-1].threadIds,__position_00,(ThreadId *)&local_50);
          }
          else {
            *__position_00._M_current = (ThreadId)local_50;
            pIVar11[-1].threadIds.
            super__Vector_base<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>
            ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        }
        *(undefined1 *)&p_Var4[3]._M_nxt = 0;
        this = local_40;
        __return_storage_ptr__ = local_48;
      }
      pvVar7 = local_48;
      pRVar8 = local_40;
      pvVar5 = local_48;
      pRVar6 = local_40;
    }
    (this->instanceIds).lockValues.flag.super___atomic_flag_base._M_i = false;
    local_48 = pvVar5;
    local_40 = pRVar6;
    pthread_mutex_unlock(local_38);
    return __return_storage_ptr__;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar10[2] = 0;
  puVar10[3] = 0;
  puVar10[4] = 0;
  puVar10[1] = puVar10 + 3;
  *(undefined1 *)(puVar10 + 3) = 0;
  *puVar10 = &PTR__NativeException_00243b68;
  __cxa_throw(puVar10,&debugger::IllegalRuntimeStateException::typeinfo,
              NativeException::~NativeException);
}

Assistant:

std::vector<debugger::InstanceState> RuntimeImp::getInstancesState() {
	CHATRA_CHECK_RUNTIME_PAUSED;

	std::vector<debugger::InstanceState> ret;
	instanceIds.forEach([&](const Instance& instance) {
		auto instanceId = instance.getId();
		if (instanceId == finalizerInstanceId || instanceId == gcInstance->getId())
			return;

		ret.emplace_back();
		auto& v = ret.back();

		v.instanceId = instance.getId();
		v.primaryPackageId = instance.primaryPackageId;

		std::lock_guard<SpinLock> lock1(instance.lockThreads);
		v.threadIds.reserve(instance.threads.size());
		for (auto& e : instance.threads)
			v.threadIds.emplace_back(static_cast<debugger::ThreadId>(static_cast<size_t>(e.first)));
	});
	return ret;
}